

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::FunctionExpression::Deserialize(FunctionExpression *this,Deserializer *deserializer)

{
  _Head_base<0UL,_duckdb::OrderModifier_*,_false> _Var1;
  undefined1 uVar2;
  uint uVar3;
  int iVar4;
  FunctionExpression *this_00;
  pointer pFVar5;
  byte bVar6;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var7;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var8;
  _Head_base<0UL,_duckdb::OrderModifier_*,_false> _Var9;
  undefined4 uVar10;
  undefined4 uVar11;
  unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
  result;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  __tmp;
  _Head_base<0UL,_duckdb::FunctionExpression_*,_false> local_70;
  undefined1 local_68 [12];
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_48;
  
  this_00 = (FunctionExpression *)operator_new(0xd8);
  FunctionExpression(this_00);
  local_70._M_head_impl = this_00;
  pFVar5 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_70);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"function_name");
  if ((char)uVar3 == '\0') {
    stack0xffffffffffffffa0 = (pointer)0x0;
    local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
    local_68._0_8_ = (pointer)local_58;
    ::std::__cxx11::string::operator=((string *)&pFVar5->function_name,(string *)local_68);
    if ((pointer)local_68._0_8_ != (pointer)local_58) goto LAB_01770476;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_68,deserializer);
    ::std::__cxx11::string::operator=((string *)&pFVar5->function_name,(string *)local_68);
    if ((pointer)local_68._0_8_ != (pointer)local_58) {
LAB_01770476:
      operator_delete((void *)local_68._0_8_);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pFVar5 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_70);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"schema");
  if ((char)uVar3 == '\0') {
    stack0xffffffffffffffa0 = (pointer)0x0;
    local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
    local_68._0_8_ = (pointer)local_58;
    ::std::__cxx11::string::operator=((string *)&pFVar5->schema,(string *)local_68);
    if ((pointer)local_68._0_8_ != (pointer)local_58) goto LAB_01770514;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_68,deserializer);
    ::std::__cxx11::string::operator=((string *)&pFVar5->schema,(string *)local_68);
    if ((pointer)local_68._0_8_ != (pointer)local_58) {
LAB_01770514:
      operator_delete((void *)local_68._0_8_);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pFVar5 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_70);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"children");
  if ((char)uVar3 == '\0') {
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._0_4_ =
         *(undefined4 *)
          &(pFVar5->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    local_68._4_4_ =
         *(undefined4 *)
          ((long)&(pFVar5->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4);
    uVar10 = *(undefined4 *)
              &(pFVar5->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    uVar11 = *(undefined4 *)
              ((long)&(pFVar5->children).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 4);
    local_58._0_8_ =
         (pFVar5->children).
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    Deserializer::
    Read<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((type *)&local_48,deserializer);
    local_68._0_4_ =
         *(undefined4 *)
          &(pFVar5->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    local_68._4_4_ =
         *(undefined4 *)
          ((long)&(pFVar5->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4);
    uVar10 = *(undefined4 *)
              &(pFVar5->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    uVar11 = *(undefined4 *)
              ((long)&(pFVar5->children).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 4);
    local_58._0_8_ =
         (pFVar5->children).
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  (pFVar5->children).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pFVar5->children).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pFVar5->children).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  stack0xffffffffffffffa0 = (pointer)CONCAT44(uVar11,uVar10);
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)local_68);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_48);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pFVar5 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_70);
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"filter");
  bVar6 = (byte)iVar4;
  if (bVar6 == 0) {
    _Var7._M_head_impl =
         (pFVar5->filter).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pFVar5->filter).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var7._M_head_impl != (ParsedExpression *)0x0) goto LAB_01770699;
    bVar6 = 0;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 == '\0') {
      _Var8._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)local_68,deserializer);
      _Var8._M_head_impl = (ParsedExpression *)local_68._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var7._M_head_impl =
         (pFVar5->filter).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pFVar5->filter).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var8._M_head_impl;
    if (_Var7._M_head_impl == (ParsedExpression *)0x0) {
      bVar6 = 1;
    }
    else {
LAB_01770699:
      (*((_Var7._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar6);
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcc,"order_bys");
  _Var9._M_head_impl = (OrderModifier *)0x0;
  if ((char)iVar4 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 == '\0') {
      _Var9._M_head_impl = (OrderModifier *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ResultModifier::Deserialize((ResultModifier *)local_68,deserializer);
      _Var9._M_head_impl = (OrderModifier *)local_68._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  pFVar5 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_70);
  _Var1._M_head_impl =
       (pFVar5->order_bys).
       super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
       super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
       super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl;
  (pFVar5->order_bys).
  super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
  super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
  super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl = _Var9._M_head_impl;
  if (_Var1._M_head_impl != (OrderModifier *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_ResultModifier + 8))();
  }
  pFVar5 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_70);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcd,"distinct");
  if ((char)uVar3 == '\0') {
    uVar2 = false;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar2 = (undefined1)iVar4;
  }
  pFVar5->distinct = (bool)uVar2;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pFVar5 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_70);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xce,"is_operator");
  if ((char)uVar3 == '\0') {
    uVar2 = false;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar2 = (undefined1)iVar4;
  }
  pFVar5->is_operator = (bool)uVar2;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pFVar5 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_70);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcf,"export_state");
  if ((char)uVar3 == '\0') {
    uVar2 = false;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar2 = (undefined1)iVar4;
  }
  pFVar5->export_state = (bool)uVar2;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pFVar5 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_70);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd0,"catalog");
  if ((char)uVar3 == '\0') {
    stack0xffffffffffffffa0 = (pointer)0x0;
    local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
    local_68._0_8_ = (OrderModifier *)local_58;
    ::std::__cxx11::string::operator=((string *)&pFVar5->catalog,(string *)local_68);
    if ((OrderModifier *)local_68._0_8_ == (OrderModifier *)local_58) goto LAB_017708b6;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_68,deserializer);
    ::std::__cxx11::string::operator=((string *)&pFVar5->catalog,(string *)local_68);
    if ((OrderModifier *)local_68._0_8_ == (OrderModifier *)local_58) goto LAB_017708b6;
  }
  operator_delete((void *)local_68._0_8_);
LAB_017708b6:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_70._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> FunctionExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<FunctionExpression>(new FunctionExpression());
	deserializer.ReadPropertyWithDefault<string>(200, "function_name", result->function_name);
	deserializer.ReadPropertyWithDefault<string>(201, "schema", result->schema);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(202, "children", result->children);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(203, "filter", result->filter);
	auto order_bys = deserializer.ReadPropertyWithDefault<unique_ptr<ResultModifier>>(204, "order_bys");
	result->order_bys = unique_ptr_cast<ResultModifier, OrderModifier>(std::move(order_bys));
	deserializer.ReadPropertyWithDefault<bool>(205, "distinct", result->distinct);
	deserializer.ReadPropertyWithDefault<bool>(206, "is_operator", result->is_operator);
	deserializer.ReadPropertyWithDefault<bool>(207, "export_state", result->export_state);
	deserializer.ReadPropertyWithDefault<string>(208, "catalog", result->catalog);
	return std::move(result);
}